

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O0

FT_Error ft_stroker_cap(FT_Stroker stroker,FT_Angle angle,FT_Int side)

{
  FT_Fixed FVar1;
  long lVar2;
  FT_StrokeBorder border_1;
  FT_Fixed radius_1;
  FT_Angle rotate_1;
  FT_Vector delta_1;
  FT_StrokeBorder border;
  FT_Fixed radius;
  FT_Angle rotate;
  FT_Vector delta2;
  FT_Vector delta;
  FT_Error error;
  FT_Int side_local;
  FT_Angle angle_local;
  FT_Stroker stroker_local;
  
  delta.y._0_4_ = 0;
  if (stroker->line_cap == FT_STROKER_LINECAP_ROUND) {
    stroker->angle_in = angle;
    stroker->angle_out = angle + 0xb40000;
    delta.y._0_4_ = ft_stroker_arcto(stroker,side);
  }
  else if (stroker->line_cap == FT_STROKER_LINECAP_SQUARE) {
    lVar2 = (long)side * -0xb40000 + 0x5a0000;
    FVar1 = stroker->radius;
    delta_1.y = (FT_Pos)(stroker->borders + side);
    FT_Vector_From_Polar((FT_Vector *)&rotate,FVar1,angle + lVar2);
    FT_Vector_From_Polar((FT_Vector *)&delta2.y,FVar1,angle);
    delta2.y = (stroker->center).x + rotate + delta2.y;
    delta.y._0_4_ = ft_stroke_border_lineto((FT_StrokeBorder)delta_1.y,(FT_Vector *)&delta2.y,'\0');
    if ((FT_Error)delta.y == 0) {
      FT_Vector_From_Polar((FT_Vector *)&rotate,FVar1,angle - lVar2);
      FT_Vector_From_Polar((FT_Vector *)&delta2.y,FVar1,angle);
      delta2.y = rotate + (stroker->center).x + delta2.y;
      delta.y._0_4_ =
           ft_stroke_border_lineto((FT_StrokeBorder)delta_1.y,(FT_Vector *)&delta2.y,'\0');
    }
  }
  else if (stroker->line_cap == FT_STROKER_LINECAP_BUTT) {
    lVar2 = (long)side * -0xb40000 + 0x5a0000;
    FVar1 = stroker->radius;
    FT_Vector_From_Polar((FT_Vector *)&rotate_1,FVar1,angle + lVar2);
    rotate_1 = (stroker->center).x + rotate_1;
    delta_1.x = (stroker->center).y + delta_1.x;
    delta.y._0_4_ = ft_stroke_border_lineto(stroker->borders + side,(FT_Vector *)&rotate_1,'\0');
    if ((FT_Error)delta.y == 0) {
      FT_Vector_From_Polar((FT_Vector *)&rotate_1,FVar1,angle - lVar2);
      rotate_1 = (stroker->center).x + rotate_1;
      delta_1.x = (stroker->center).y + delta_1.x;
      delta.y._0_4_ = ft_stroke_border_lineto(stroker->borders + side,(FT_Vector *)&rotate_1,'\0');
    }
  }
  return (FT_Error)delta.y;
}

Assistant:

static FT_Error
  ft_stroker_cap( FT_Stroker  stroker,
                  FT_Angle    angle,
                  FT_Int      side )
  {
    FT_Error  error = FT_Err_Ok;


    if ( stroker->line_cap == FT_STROKER_LINECAP_ROUND )
    {
      /* add a round cap */
      stroker->angle_in  = angle;
      stroker->angle_out = angle + FT_ANGLE_PI;

      error = ft_stroker_arcto( stroker, side );
    }
    else if ( stroker->line_cap == FT_STROKER_LINECAP_SQUARE )
    {
      /* add a square cap */
      FT_Vector        delta, delta2;
      FT_Angle         rotate = FT_SIDE_TO_ROTATE( side );
      FT_Fixed         radius = stroker->radius;
      FT_StrokeBorder  border = stroker->borders + side;


      FT_Vector_From_Polar( &delta2, radius, angle + rotate );
      FT_Vector_From_Polar( &delta,  radius, angle );

      delta.x += stroker->center.x + delta2.x;
      delta.y += stroker->center.y + delta2.y;

      error = ft_stroke_border_lineto( border, &delta, FALSE );
      if ( error )
        goto Exit;

      FT_Vector_From_Polar( &delta2, radius, angle - rotate );
      FT_Vector_From_Polar( &delta,  radius, angle );

      delta.x += delta2.x + stroker->center.x;
      delta.y += delta2.y + stroker->center.y;

      error = ft_stroke_border_lineto( border, &delta, FALSE );
    }
    else if ( stroker->line_cap == FT_STROKER_LINECAP_BUTT )
    {
      /* add a butt ending */
      FT_Vector        delta;
      FT_Angle         rotate = FT_SIDE_TO_ROTATE( side );
      FT_Fixed         radius = stroker->radius;
      FT_StrokeBorder  border = stroker->borders + side;


      FT_Vector_From_Polar( &delta, radius, angle + rotate );

      delta.x += stroker->center.x;
      delta.y += stroker->center.y;

      error = ft_stroke_border_lineto( border, &delta, FALSE );
      if ( error )
        goto Exit;

      FT_Vector_From_Polar( &delta, radius, angle - rotate );

      delta.x += stroker->center.x;
      delta.y += stroker->center.y;

      error = ft_stroke_border_lineto( border, &delta, FALSE );
    }

  Exit:
    return error;
  }